

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::shaderexecutor::PackUnorm4x8Case::createInstance(PackUnorm4x8Case *this,Context *ctx)

{
  ShaderType shaderType;
  Precision precision;
  PackUnorm4x8CaseInstance *this_00;
  char *name;
  Context *ctx_local;
  PackUnorm4x8Case *this_local;
  
  this_00 = (PackUnorm4x8CaseInstance *)operator_new(0xb0);
  shaderType = (this->super_ShaderPackingFunctionCase).m_shaderType;
  precision = this->m_precision;
  name = tcu::TestNode::getName((TestNode *)this);
  PackUnorm4x8CaseInstance::PackUnorm4x8CaseInstance
            (this_00,ctx,shaderType,&(this->super_ShaderPackingFunctionCase).m_spec,precision,name);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new PackUnorm4x8CaseInstance(ctx, m_shaderType, m_spec, m_precision, getName());
	}